

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

Vec_Int_t * Gia_ManTransfer(Gia_Man_t *pAig,Gia_Man_t *pCof,Gia_Man_t *pNew,Vec_Int_t *vSigs)

{
  int *piVar1;
  int iVar2;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  
  p = Vec_IntAlloc(100);
  i = 0;
  do {
    if (vSigs->nSize <= i) {
      return p;
    }
    iVar2 = Vec_IntEntry(vSigs,i);
    pGVar3 = Gia_ManObj(pAig,iVar2);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      return p;
    }
    iVar2 = Gia_ObjIsCand(pGVar3);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsCand(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                    ,0x395,
                    "Vec_Int_t *Gia_ManTransfer(Gia_Man_t *, Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = Abc_Lit2Var(pGVar3->Value);
    pGVar3 = Gia_ManObj(pCof,iVar2);
    if (1 < pGVar3->Value + 1) {
      iVar2 = Abc_Lit2Var(pGVar3->Value);
      uVar4 = (ulong)(uint)p->nSize;
      if (p->nSize < 1) {
        uVar4 = 0;
      }
      uVar5 = 0;
      do {
        if (uVar4 == uVar5) {
          Vec_IntPush(p,iVar2);
          break;
        }
        piVar1 = p->pArray + uVar5;
        uVar5 = uVar5 + 1;
      } while (*piVar1 != iVar2);
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_ManTransfer( Gia_Man_t * pAig, Gia_Man_t * pCof, Gia_Man_t * pNew, Vec_Int_t * vSigs )
{
    Vec_Int_t * vSigsNew;
    Gia_Obj_t * pObj, * pObjF;
    int i;
    vSigsNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObjVec( vSigs, pAig, pObj, i )
    {
        assert( Gia_ObjIsCand(pObj) );
        pObjF = Gia_ManObj( pCof, Abc_Lit2Var(pObj->Value) );
        if ( pObjF->Value && ~pObjF->Value )
            Vec_IntPushUnique( vSigsNew, Abc_Lit2Var(pObjF->Value) );
    }
    return vSigsNew;    
}